

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

void __thiscall ear::Triplet::Triplet(Triplet *this,Vector3i *outputChannels,Matrix3d *positions)

{
  VectorXi local_40;
  MatrixXd local_30;
  Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_18;
  
  Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<int,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_40,
             (DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)outputChannels);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_30,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)positions);
  RegionHandler::RegionHandler(&this->super_RegionHandler,&local_40,&local_30);
  free(local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_00212a50;
  local_18 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &(this->super_RegionHandler)._positions);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->_basis,&local_18);
  return;
}

Assistant:

Triplet::Triplet(Eigen::Vector3i outputChannels, Eigen::Matrix3d positions)
      : RegionHandler(outputChannels, positions) {
    _basis = _positions.inverse();
  }